

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_591968::ErrorResilienceTestLarge::DoDecode(ErrorResilienceTestLarge *this)

{
  uint *puVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  
  bVar2 = true;
  if (((ulong)this->error_nframes_ != 0) &&
     (bVar2 = true, ((this->super_EncoderTest).cfg_.g_pass & ~AOM_RC_LAST_PASS) == AOM_RC_ONE_PASS))
  {
    uVar4 = 0;
    do {
      if (this->error_nframes_ == uVar4) {
        return true;
      }
      puVar1 = this->error_frames_ + uVar4;
      uVar4 = uVar4 + 1;
    } while (*puVar1 != this->nframes_ - 1);
    poVar3 = std::operator<<((ostream *)&std::cout,"             Skipping decoding frame: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DoDecode() const override {
    if (error_nframes_ > 0 &&
        (cfg_.g_pass == AOM_RC_LAST_PASS || cfg_.g_pass == AOM_RC_ONE_PASS)) {
      for (unsigned int i = 0; i < error_nframes_; ++i) {
        if (error_frames_[i] == nframes_ - 1) {
          std::cout << "             Skipping decoding frame: "
                    << error_frames_[i] << "\n";
          return false;
        }
      }
    }
    return true;
  }